

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<double,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  iVar5 = Xc_indptr[col_num];
  lVar11 = (long)iVar5;
  iVar6 = Xc_indptr[col_num + 1];
  lVar14 = (long)iVar6;
  bVar12 = true;
  if (iVar6 == iVar5) goto LAB_001710ae;
  iVar7 = Xc_ind[lVar11];
  if ((int)ix_arr[end] < iVar7) goto LAB_001710ae;
  lVar1 = lVar14 + -1;
  iVar8 = Xc_ind[lVar1];
  if (iVar8 < (int)ix_arr[st]) goto LAB_001710ae;
  puVar3 = ix_arr + end;
  puVar16 = ix_arr + st;
  uVar13 = (end - st) + 1;
  if (((iVar8 < (int)ix_arr[end]) || ((ulong)(lVar14 - lVar11) < uVar13)) ||
     ((int)ix_arr[st] < iVar7)) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  puVar2 = puVar3 + 1;
  uVar15 = (long)puVar2 - (long)puVar16 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar15) {
      uVar18 = uVar15 >> 1;
      uVar17 = ~uVar18 + uVar15;
      uVar15 = uVar18;
      if (puVar16[uVar18] < (ulong)(long)iVar7) {
        puVar16 = puVar16 + uVar18 + 1;
        uVar15 = uVar17;
      }
    }
    if (iVar5 == iVar6 || puVar16 == puVar2) goto LAB_0017103b;
    dVar22 = *xmax;
    dVar23 = *xmin;
    lVar10 = lVar1 * 4 + 4;
    uVar15 = 0;
    while (uVar17 = *puVar16, uVar17 <= (ulong)(long)iVar8) {
      piVar19 = Xc_ind + lVar11;
      iVar5 = *piVar19;
      if (iVar5 == (int)uVar17) {
        uVar15 = uVar15 + 1;
        dVar4 = Xc[lVar11];
        dVar24 = dVar4;
        if (dVar23 <= dVar4) {
          dVar24 = dVar23;
        }
        dVar23 = dVar24;
        *xmin = dVar23;
        if (dVar4 <= dVar22) {
          dVar4 = dVar22;
        }
        *xmax = dVar4;
        if ((puVar16 == puVar3) || (lVar11 == lVar1)) break;
        puVar16 = puVar16 + 1;
        uVar17 = (long)Xc_ind + (lVar10 - (long)piVar19) >> 2;
        if (0 < (long)uVar17) {
          do {
            uVar18 = uVar17 >> 1;
            uVar20 = ~uVar18 + uVar17;
            uVar17 = uVar18;
            if ((ulong)(long)piVar19[uVar18] < *puVar16) {
              piVar19 = piVar19 + uVar18 + 1;
              uVar17 = uVar20;
            }
          } while (0 < (long)uVar17);
        }
        lVar11 = (long)piVar19 - (long)Xc_ind;
        dVar22 = dVar4;
LAB_00171221:
        lVar11 = lVar11 >> 2;
      }
      else {
        if (iVar5 <= (int)uVar17) {
          piVar9 = piVar19 + 1;
          uVar18 = (long)Xc_ind + (lVar10 - (long)(piVar19 + 1)) >> 2;
          while (0 < (long)uVar18) {
            uVar20 = uVar18 >> 1;
            uVar21 = ~uVar20 + uVar18;
            uVar18 = uVar20;
            if ((ulong)(long)piVar9[uVar20] < uVar17) {
              piVar9 = piVar9 + uVar20 + 1;
              uVar18 = uVar21;
            }
          }
          lVar11 = (long)piVar9 - (long)Xc_ind;
          goto LAB_00171221;
        }
        puVar16 = puVar16 + 1;
        uVar17 = (long)puVar2 - (long)puVar16 >> 3;
        while (0 < (long)uVar17) {
          uVar18 = uVar17 >> 1;
          uVar20 = ~uVar18 + uVar17;
          uVar17 = uVar18;
          if (puVar16[uVar18] < (ulong)(long)iVar5) {
            puVar16 = puVar16 + uVar18 + 1;
            uVar17 = uVar20;
          }
        }
      }
      if ((puVar16 == puVar2) || (lVar11 == lVar14)) break;
    }
  }
  else {
    while (0 < (long)uVar15) {
      uVar17 = uVar15 >> 1;
      uVar18 = ~uVar17 + uVar15;
      uVar15 = uVar17;
      if (puVar16[uVar17] < (ulong)(long)iVar7) {
        puVar16 = puVar16 + uVar17 + 1;
        uVar15 = uVar18;
      }
    }
    if (iVar5 == iVar6 || puVar16 == puVar2) {
LAB_0017103b:
      uVar15 = 0;
    }
    else {
      dVar22 = *xmax;
      dVar23 = *xmin;
      lVar10 = lVar1 * 4 + 4;
      uVar15 = 0;
      while (uVar17 = *puVar16, uVar17 <= (ulong)(long)iVar8) {
        piVar19 = Xc_ind + lVar11;
        iVar5 = *piVar19;
        if (iVar5 == (int)uVar17) {
          uVar15 = uVar15 + 1;
          dVar4 = Xc[lVar11];
          dVar24 = dVar4;
          if (dVar23 <= dVar4) {
            dVar24 = dVar23;
          }
          dVar23 = (double)(~-(ulong)NAN(dVar23) & (ulong)dVar24 |
                           -(ulong)NAN(dVar23) & (ulong)dVar4);
          *xmin = dVar23;
          dVar24 = dVar4;
          if (dVar4 <= dVar22) {
            dVar24 = dVar22;
          }
          dVar22 = (double)(~-(ulong)NAN(dVar22) & (ulong)dVar24 |
                           -(ulong)NAN(dVar22) & (ulong)dVar4);
          *xmax = dVar22;
          if ((puVar16 == puVar3) || (lVar11 == lVar1)) break;
          puVar16 = puVar16 + 1;
          uVar17 = (long)Xc_ind + (lVar10 - (long)piVar19) >> 2;
          if (0 < (long)uVar17) {
            do {
              uVar18 = uVar17 >> 1;
              uVar20 = ~uVar18 + uVar17;
              uVar17 = uVar18;
              if ((ulong)(long)piVar19[uVar18] < *puVar16) {
                piVar19 = piVar19 + uVar18 + 1;
                uVar17 = uVar20;
              }
            } while (0 < (long)uVar17);
          }
          lVar11 = (long)piVar19 - (long)Xc_ind;
LAB_00170fda:
          lVar11 = lVar11 >> 2;
        }
        else {
          if (iVar5 <= (int)uVar17) {
            piVar9 = piVar19 + 1;
            uVar18 = (long)Xc_ind + (lVar10 - (long)(piVar19 + 1)) >> 2;
            while (0 < (long)uVar18) {
              uVar20 = uVar18 >> 1;
              uVar21 = ~uVar20 + uVar18;
              uVar18 = uVar20;
              if ((ulong)(long)piVar9[uVar20] < uVar17) {
                piVar9 = piVar9 + uVar20 + 1;
                uVar18 = uVar21;
              }
            }
            lVar11 = (long)piVar9 - (long)Xc_ind;
            goto LAB_00170fda;
          }
          puVar16 = puVar16 + 1;
          uVar17 = (long)puVar2 - (long)puVar16 >> 3;
          while (0 < (long)uVar17) {
            uVar18 = uVar17 >> 1;
            uVar20 = ~uVar18 + uVar17;
            uVar17 = uVar18;
            if (puVar16[uVar18] < (ulong)(long)iVar5) {
              puVar16 = puVar16 + uVar18 + 1;
              uVar17 = uVar20;
            }
          }
        }
        if ((puVar16 == puVar2) || (lVar11 == lVar14)) break;
      }
    }
  }
  if (uVar15 < uVar13) {
    dVar22 = *xmin;
    if (0.0 <= *xmin) {
      dVar22 = 0.0;
    }
    *xmin = dVar22;
    dVar22 = *xmax;
    if (*xmax <= 0.0) {
      dVar22 = 0.0;
    }
    *xmax = dVar22;
  }
  dVar22 = *xmin;
  dVar23 = *xmax;
  if (((dVar22 != dVar23) || (NAN(dVar22) || NAN(dVar23))) &&
     (dVar23 != -INFINITY || dVar22 != INFINITY)) {
    bVar12 = NAN(dVar23);
  }
LAB_001710ae:
  *unsplittable = bVar12;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}